

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

uint8_t * __thiscall H264StreamReader::writeNalPrefix(H264StreamReader *this,uint8_t *curPos)

{
  if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
    *curPos = '\0';
    curPos = curPos + 1;
  }
  curPos[0] = '\0';
  curPos[1] = '\0';
  curPos[2] = '\x01';
  return curPos + 3;
}

Assistant:

uint8_t *H264StreamReader::writeNalPrefix(uint8_t *curPos) const
{
    if (!m_shortStartCodes)
        *curPos++ = 0;
    *curPos++ = 0;
    *curPos++ = 0;
    *curPos++ = 1;
    return curPos;
}